

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O0

void __thiscall cfd::core::HashUtil::HashUtil(HashUtil *this,uint8_t hash_type)

{
  undefined8 uVar1;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff94;
  CfdError in_stack_ffffffffffffff9c;
  CfdException *in_stack_ffffffffffffffa0;
  string local_58 [32];
  SupportHashFormat *local_38;
  SupportHashFormat *item;
  SupportHashFormat *__end2;
  SupportHashFormat *__begin2;
  SupportHashFormat (*__range2) [6];
  HashUtil *pHStack_10;
  uint8_t hash_type_local;
  HashUtil *this_local;
  
  this->_vptr_HashUtil = (_func_int **)&PTR__HashUtil_00b635d0;
  this->hash_type_ = hash_type;
  __range2._7_1_ = hash_type;
  pHStack_10 = this;
  ByteData::ByteData(&this->buffer_);
  __begin2 = (SupportHashFormat *)kFormatList;
  item = (SupportHashFormat *)kBase64EncodeTable_abi_cxx11_;
  for (__end2 = (SupportHashFormat *)kFormatList;
      __end2 != (SupportHashFormat *)kBase64EncodeTable_abi_cxx11_; __end2 = __end2 + 1) {
    local_38 = __end2;
    if (__end2->type == '\0') break;
    if (__range2._7_1_ == __end2->type) {
      return;
    }
  }
  uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffff90);
  uVar1 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_58,"unknown hash type.",(allocator *)&stack0xffffffffffffffa7);
  CfdException::CfdException
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
             (string *)CONCAT44(in_stack_ffffffffffffff94,uVar2));
  __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

HashUtil::HashUtil(uint8_t hash_type) : hash_type_(hash_type) {
  for (const auto &item : kFormatList) {
    if (item.type == 0) break;
    if (hash_type == item.type) return;
  }
  throw CfdException(kCfdInternalError, "unknown hash type.");
}